

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtimezoneprivate_tz.cpp
# Opt level: O3

QTzTimeZoneCacheEntry *
QTzTimeZoneCache::findEntry(QTzTimeZoneCacheEntry *__return_storage_ptr__,QByteArray *ianaId)

{
  QList<QByteArray> *this;
  uint *puVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  QString *this_00;
  Data *pDVar5;
  undefined8 uVar6;
  QTzTransition *pQVar7;
  Data *data;
  char *pcVar8;
  undefined1 auVar9 [8];
  int iVar10;
  int iVar11;
  bool bVar12;
  anon_struct_2_2_9f07e537 aVar13;
  int iVar14;
  Status SVar15;
  _Rb_tree_node_base *p_Var16;
  pointer pQVar17;
  storage_type *in_RCX;
  ulong uVar18;
  int extraout_EDX;
  int extraout_EDX_00;
  quint8 qVar19;
  int iVar20;
  uint uVar21;
  uint uVar22;
  long lVar23;
  uint uVar24;
  byte *pbVar25;
  ulong uVar26;
  _Rb_tree_node_base *p_Var27;
  uint uVar28;
  qsizetype qVar29;
  undefined1 *puVar30;
  ulong uVar31;
  long in_FS_OFFSET;
  QByteArrayView ba;
  QMap<int,_QByteArray> abbrevMap;
  bool ok;
  QTzHeader hdr2;
  QTzHeader hdr;
  QList<QTzTransition> local_158;
  undefined1 local_140 [16];
  QTzTransition *pQStack_130;
  undefined1 *local_128;
  QList<QTzTransition> local_118;
  QByteArray local_f8;
  bool local_d9;
  QFile local_d8;
  undefined1 local_c8 [16];
  undefined1 local_b8 [24];
  undefined1 *puStack_a0;
  undefined1 local_98 [8];
  QTzTransition *pQStack_90;
  undefined8 local_88;
  quint32 qStack_80;
  quint32 qStack_7c;
  quint32 qStack_78;
  undefined1 *puStack_74;
  undefined1 local_68 [16];
  undefined8 local_58;
  quint32 local_50;
  quint32 local_4c;
  quint32 qStack_48;
  undefined1 *puStack_44;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined1 **)&(__return_storage_ptr__->m_preZoneRule).abbreviationIndex = &DAT_aaaaaaaaaaaaaaaa
  ;
  __return_storage_ptr__->m_hasDst = false;
  (__return_storage_ptr__->m_tranTimes).d.d = (Data *)0x0;
  (__return_storage_ptr__->m_tranTimes).d.ptr = (QTzTransitionTime *)0x0;
  (__return_storage_ptr__->m_tranTimes).d.size = 0;
  (__return_storage_ptr__->m_tranRules).d.d = (Data *)0x0;
  (__return_storage_ptr__->m_tranRules).d.ptr = (QTzTransitionRule *)0x0;
  (__return_storage_ptr__->m_tranRules).d.size = 0;
  (__return_storage_ptr__->m_abbreviations).d.d = (Data *)0x0;
  (__return_storage_ptr__->m_abbreviations).d.ptr = (QByteArray *)0x0;
  (__return_storage_ptr__->m_abbreviations).d.size = 0;
  (__return_storage_ptr__->m_posixRule).d.d = (Data *)0x0;
  (__return_storage_ptr__->m_posixRule).d.ptr = (char *)0x0;
  (__return_storage_ptr__->m_posixRule).d.size = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->m_posixRule).d.size + 1) = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->m_preZoneRule).stdOffset + 1) = 0;
  local_d8.super_QFileDevice.super_QIODevice.super_QObject._vptr_QObject =
       (_func_int **)&DAT_aaaaaaaaaaaaaaaa;
  local_d8.super_QFileDevice.super_QIODevice.super_QObject.d_ptr.d =
       (QObjectData *)&DAT_aaaaaaaaaaaaaaaa;
  QFile::QFile(&local_d8);
  this_00 = (QString *)(ianaId->d).size;
  if (this_00 == (QString *)0x0) {
    local_68._0_8_ = (QArrayData *)0x0;
    local_68._8_8_ = L"/etc/localtime";
    local_58 = (undefined1 *)0xe;
    QFile::setFileName(&local_d8,(QString *)local_68);
    iVar14 = extraout_EDX;
    if ((QArrayData *)local_68._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_68._0_8_,2,0x10);
        iVar14 = extraout_EDX_00;
      }
    }
    iVar14 = QFile::open(&local_d8,(char *)0x1,iVar14);
    if ((char)iVar14 == '\0') goto LAB_003fae38;
  }
  else {
    ba.m_data = in_RCX;
    ba.m_size = (qsizetype)(ianaId->d).ptr;
    QString::fromLocal8Bit((QString *)local_68,this_00,ba);
    bVar12 = openZoneInfo((QString *)local_68,&local_d8);
    if ((QArrayData *)local_68._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_68._0_8_,2,0x10);
      }
    }
    if (!bVar12) {
      aVar13 = validatePosixRule(ianaId,false);
      if (((ushort)aVar13 & 1) != 0) {
        __return_storage_ptr__->m_hasDst = 0xff < (ushort)aVar13;
        QByteArray::operator=(&__return_storage_ptr__->m_posixRule,ianaId);
      }
      goto LAB_003fae38;
    }
  }
  local_b8._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  puStack_a0 = &DAT_aaaaaaaaaaaaaaaa;
  local_b8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_b8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QDataStream::QDataStream((QDataStream *)local_b8,(QIODevice *)&local_d8);
  local_d9 = false;
  local_f8.d.d = (Data *)0x0;
  local_f8.d.ptr = (char *)0x0;
  local_f8.d.size = 0;
  qStack_48 = 0xaaaaaaaa;
  puStack_44 = &DAT_aaaaaaaaaaaaaaaa;
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  local_50 = 0xaaaaaaaa;
  local_4c = 0xaaaaaaaa;
  local_68._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_68._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  parseTzHeader((QTzHeader *)local_68,(QDataStream *)local_b8,&local_d9);
  if ((local_d9 == true) && (SVar15 = QDataStream::status((QDataStream *)local_b8), SVar15 == Ok)) {
    local_118.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_118.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_118.d.ptr = (QTzTransition *)&DAT_aaaaaaaaaaaaaaaa;
    parseTzTransitions(&local_118,(QDataStream *)local_b8,qStack_48,false);
    SVar15 = QDataStream::status((QDataStream *)local_b8);
    if (SVar15 == Ok) {
      local_128 = &DAT_aaaaaaaaaaaaaaaa;
      local_140._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      pQStack_130 = (QTzTransition *)&DAT_aaaaaaaaaaaaaaaa;
      parseTzTypes((QList<QTzType> *)(local_140 + 8),(QDataStream *)local_b8,(quint32)puStack_44);
      SVar15 = QDataStream::status((QDataStream *)local_b8);
      if (SVar15 == Ok) {
        local_140._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
        parseTzAbbreviations
                  ((QDataStream *)local_140,(int)local_b8,
                   (QList<QTzType> *)((ulong)puStack_44 >> 0x20));
        SVar15 = QDataStream::status((QDataStream *)local_b8);
        if (SVar15 == Ok) {
          parseTzLeapSeconds((QDataStream *)local_b8,local_4c,false);
          SVar15 = QDataStream::status((QDataStream *)local_b8);
          if (SVar15 == Ok) {
            parseTzIndicators((QList<QTzType> *)local_98,(QDataStream *)local_b8,
                              (QList<QTzType> *)(local_140 + 8),local_50,local_58._4_4_);
            local_128 = local_88;
            pQStack_130 = pQStack_90;
            auVar9 = local_98;
            uVar6 = local_140._8_8_;
            local_88 = (undefined1 *)0x0;
            local_98 = (undefined1  [8])0x0;
            pQStack_90 = (QTzTransition *)0x0;
            local_140._8_8_ = auVar9;
            if ((QMapData<std::map<int,_QByteArray,_std::less<int>,_std::allocator<std::pair<const_int,_QByteArray>_>_>_>
                 *)uVar6 !=
                (QMapData<std::map<int,_QByteArray,_std::less<int>,_std::allocator<std::pair<const_int,_QByteArray>_>_>_>
                 *)0x0) {
              LOCK();
              (((QBasicAtomicInt *)uVar6)->_q_value).super___atomic_base<int>._M_i =
                   (((QBasicAtomicInt *)uVar6)->_q_value).super___atomic_base<int>._M_i + -1;
              UNLOCK();
              if ((((QBasicAtomicInt *)uVar6)->_q_value).super___atomic_base<int>._M_i == 0) {
                QArrayData::deallocate((QArrayData *)uVar6,8,0x10);
              }
            }
            if (local_98 != (undefined1  [8])0x0) {
              LOCK();
              (((QBasicAtomicInt *)local_98)->_q_value).super___atomic_base<int>._M_i =
                   (((QBasicAtomicInt *)local_98)->_q_value).super___atomic_base<int>._M_i + -1;
              UNLOCK();
              if ((((QBasicAtomicInt *)local_98)->_q_value).super___atomic_base<int>._M_i == 0) {
                QArrayData::deallocate((QArrayData *)local_98,8,0x10);
              }
            }
            SVar15 = QDataStream::status((QDataStream *)local_b8);
            if (SVar15 == Ok) {
              if ((local_68[4] & 0xfe) == 0x32) {
                local_d9 = false;
                qStack_78 = 0xaaaaaaaa;
                puStack_74 = &DAT_aaaaaaaaaaaaaaaa;
                local_88 = &DAT_aaaaaaaaaaaaaaaa;
                qStack_80 = 0xaaaaaaaa;
                qStack_7c = 0xaaaaaaaa;
                local_98 = (undefined1  [8])&DAT_aaaaaaaaaaaaaaaa;
                pQStack_90 = (QTzTransition *)&DAT_aaaaaaaaaaaaaaaa;
                parseTzHeader((QTzHeader *)local_98,(QDataStream *)local_b8,&local_d9);
                if ((local_d9 == true) &&
                   (SVar15 = QDataStream::status((QDataStream *)local_b8), SVar15 == Ok)) {
                  parseTzTransitions(&local_158,(QDataStream *)local_b8,qStack_78,true);
                  pDVar5 = local_118.d.d;
                  local_118.d.size = local_158.d.size;
                  local_118.d.ptr = local_158.d.ptr;
                  local_118.d.d = local_158.d.d;
                  local_158.d.size = 0;
                  local_158.d.d = (Data *)0x0;
                  local_158.d.ptr = (QTzTransition *)0x0;
                  if ((QMapData<std::map<int,_QByteArray,_std::less<int>,_std::allocator<std::pair<const_int,_QByteArray>_>_>_>
                       *)pDVar5 !=
                      (QMapData<std::map<int,_QByteArray,_std::less<int>,_std::allocator<std::pair<const_int,_QByteArray>_>_>_>
                       *)0x0) {
                    LOCK();
                    (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                         (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
                    ;
                    UNLOCK();
                    if ((pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
                    {
                      QArrayData::deallocate(&pDVar5->super_QArrayData,0x10,0x10);
                    }
                  }
                  if ((QMapData<std::map<int,_QByteArray,_std::less<int>,_std::allocator<std::pair<const_int,_QByteArray>_>_>_>
                       *)local_158.d.d !=
                      (QMapData<std::map<int,_QByteArray,_std::less<int>,_std::allocator<std::pair<const_int,_QByteArray>_>_>_>
                       *)0x0) {
                    LOCK();
                    ((local_158.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                         = ((local_158.d.d)->super_QArrayData).ref_._q_value.
                           super___atomic_base<int>._M_i + -1;
                    UNLOCK();
                    if (((local_158.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                        _M_i == 0) {
                      QArrayData::deallocate(&(local_158.d.d)->super_QArrayData,0x10,0x10);
                    }
                  }
                  SVar15 = QDataStream::status((QDataStream *)local_b8);
                  if (SVar15 == Ok) {
                    parseTzTypes((QList<QTzType> *)&local_158,(QDataStream *)local_b8,
                                 (quint32)puStack_74);
                    uVar6 = local_140._8_8_;
                    local_128 = (undefined1 *)local_158.d.size;
                    pQStack_130 = local_158.d.ptr;
                    local_140._8_8_ = local_158.d.d;
                    local_158.d.size = 0;
                    local_158.d.d = (Data *)0x0;
                    local_158.d.ptr = (QTzTransition *)0x0;
                    if ((QMapData<std::map<int,_QByteArray,_std::less<int>,_std::allocator<std::pair<const_int,_QByteArray>_>_>_>
                         *)uVar6 !=
                        (QMapData<std::map<int,_QByteArray,_std::less<int>,_std::allocator<std::pair<const_int,_QByteArray>_>_>_>
                         *)0x0) {
                      LOCK();
                      (((QBasicAtomicInt *)uVar6)->_q_value).super___atomic_base<int>._M_i =
                           (((QBasicAtomicInt *)uVar6)->_q_value).super___atomic_base<int>._M_i + -1
                      ;
                      UNLOCK();
                      if ((((QBasicAtomicInt *)uVar6)->_q_value).super___atomic_base<int>._M_i == 0)
                      {
                        QArrayData::deallocate((QArrayData *)uVar6,8,0x10);
                      }
                    }
                    if ((QMapData<std::map<int,_QByteArray,_std::less<int>,_std::allocator<std::pair<const_int,_QByteArray>_>_>_>
                         *)local_158.d.d !=
                        (QMapData<std::map<int,_QByteArray,_std::less<int>,_std::allocator<std::pair<const_int,_QByteArray>_>_>_>
                         *)0x0) {
                      LOCK();
                      ((local_158.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                      _M_i = ((local_158.d.d)->super_QArrayData).ref_._q_value.
                             super___atomic_base<int>._M_i + -1;
                      UNLOCK();
                      if (((local_158.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>
                          ._M_i == 0) {
                        QArrayData::deallocate(&(local_158.d.d)->super_QArrayData,8,0x10);
                      }
                    }
                    SVar15 = QDataStream::status((QDataStream *)local_b8);
                    if (SVar15 == Ok) {
                      parseTzAbbreviations
                                ((QDataStream *)local_c8,(int)local_b8,
                                 (QList<QTzType> *)((ulong)puStack_74 >> 0x20));
                      uVar6 = local_c8._0_8_;
                      local_158.d.d = (Data *)local_140._0_8_;
                      local_c8._0_8_ =
                           (QMapData<std::map<int,_QByteArray,_std::less<int>,_std::allocator<std::pair<const_int,_QByteArray>_>_>_>
                            *)0x0;
                      local_140._0_8_ = uVar6;
                      QtPrivate::
                      QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QByteArray,_std::less<int>,_std::allocator<std::pair<const_int,_QByteArray>_>_>_>_>
                      ::~QExplicitlySharedDataPointerV2
                                ((QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QByteArray,_std::less<int>,_std::allocator<std::pair<const_int,_QByteArray>_>_>_>_>
                                  *)&local_158);
                      QtPrivate::
                      QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QByteArray,_std::less<int>,_std::allocator<std::pair<const_int,_QByteArray>_>_>_>_>
                      ::~QExplicitlySharedDataPointerV2
                                ((QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QByteArray,_std::less<int>,_std::allocator<std::pair<const_int,_QByteArray>_>_>_>_>
                                  *)local_c8);
                      SVar15 = QDataStream::status((QDataStream *)local_b8);
                      if (SVar15 == Ok) {
                        parseTzLeapSeconds((QDataStream *)local_b8,qStack_7c,true);
                        SVar15 = QDataStream::status((QDataStream *)local_b8);
                        if (SVar15 == Ok) {
                          parseTzIndicators((QList<QTzType> *)&local_158,(QDataStream *)local_b8,
                                            (QList<QTzType> *)(local_140 + 8),qStack_80,
                                            local_88._4_4_);
                          uVar6 = local_140._8_8_;
                          local_128 = (undefined1 *)local_158.d.size;
                          pQStack_130 = local_158.d.ptr;
                          local_140._8_8_ = local_158.d.d;
                          local_158.d.size = 0;
                          local_158.d.d = (Data *)0x0;
                          local_158.d.ptr = (QTzTransition *)0x0;
                          if ((QMapData<std::map<int,_QByteArray,_std::less<int>,_std::allocator<std::pair<const_int,_QByteArray>_>_>_>
                               *)uVar6 !=
                              (QMapData<std::map<int,_QByteArray,_std::less<int>,_std::allocator<std::pair<const_int,_QByteArray>_>_>_>
                               *)0x0) {
                            LOCK();
                            (((QBasicAtomicInt *)uVar6)->_q_value).super___atomic_base<int>._M_i =
                                 (((QBasicAtomicInt *)uVar6)->_q_value).super___atomic_base<int>.
                                 _M_i + -1;
                            UNLOCK();
                            if ((((QBasicAtomicInt *)uVar6)->_q_value).super___atomic_base<int>._M_i
                                == 0) {
                              QArrayData::deallocate((QArrayData *)uVar6,8,0x10);
                            }
                          }
                          if ((QMapData<std::map<int,_QByteArray,_std::less<int>,_std::allocator<std::pair<const_int,_QByteArray>_>_>_>
                               *)local_158.d.d !=
                              (QMapData<std::map<int,_QByteArray,_std::less<int>,_std::allocator<std::pair<const_int,_QByteArray>_>_>_>
                               *)0x0) {
                            LOCK();
                            ((local_158.d.d)->super_QArrayData).ref_._q_value.
                            super___atomic_base<int>._M_i =
                                 ((local_158.d.d)->super_QArrayData).ref_._q_value.
                                 super___atomic_base<int>._M_i + -1;
                            UNLOCK();
                            if (((local_158.d.d)->super_QArrayData).ref_._q_value.
                                super___atomic_base<int>._M_i == 0) {
                              QArrayData::deallocate(&(local_158.d.d)->super_QArrayData,8,0x10);
                            }
                          }
                          SVar15 = QDataStream::status((QDataStream *)local_b8);
                          if (SVar15 == Ok) {
                            parseTzPosixRule((QByteArray *)&local_158,(QDataStream *)local_b8);
                            pcVar8 = local_f8.d.ptr;
                            data = local_f8.d.d;
                            qVar29 = local_158.d.size;
                            pDVar5 = local_158.d.d;
                            local_158.d.d = (Data *)local_f8.d.d;
                            local_f8.d.d = (Data *)pDVar5;
                            local_f8.d.ptr = (char *)local_158.d.ptr;
                            local_158.d.ptr = (QTzTransition *)pcVar8;
                            local_158.d.size = local_f8.d.size;
                            local_f8.d.size = qVar29;
                            if ((QMapData<std::map<int,_QByteArray,_std::less<int>,_std::allocator<std::pair<const_int,_QByteArray>_>_>_>
                                 *)data !=
                                (QMapData<std::map<int,_QByteArray,_std::less<int>,_std::allocator<std::pair<const_int,_QByteArray>_>_>_>
                                 *)0x0) {
                              LOCK();
                              (data->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                                   (data->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                                   _M_i + -1;
                              UNLOCK();
                              if ((data->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                                  _M_i == 0) {
                                QArrayData::deallocate(&data->super_QArrayData,1,0x10);
                              }
                            }
                            SVar15 = QDataStream::status((QDataStream *)local_b8);
                            if (SVar15 == Ok) goto LAB_003fb3a9;
                          }
                        }
                      }
                    }
                  }
                }
              }
              else {
LAB_003fb3a9:
                if ((undefined1 *)local_f8.d.size != (undefined1 *)0x0) {
                  aVar13 = validatePosixRule(&local_f8,false);
                  if (((ushort)aVar13 & 1) == 0) goto LAB_003fb02a;
                  QByteArray::operator=(&__return_storage_ptr__->m_posixRule,&local_f8);
                  __return_storage_ptr__->m_hasDst = 0xff < (ushort)aVar13;
                }
                if ((QMapData<std::map<int,_QByteArray,_std::less<int>,_std::allocator<std::pair<const_int,_QByteArray>_>_>_>
                     *)local_140._0_8_ ==
                    (QMapData<std::map<int,_QByteArray,_std::less<int>,_std::allocator<std::pair<const_int,_QByteArray>_>_>_>
                     *)0x0) {
                  qVar29 = 0;
                }
                else {
                  qVar29 = (qsizetype)
                           (((QArrayData *)(local_140._0_8_ + 0x30))->ref_)._q_value.
                           super___atomic_base<int>._M_i;
                }
                this = &__return_storage_ptr__->m_abbreviations;
                QList<QByteArray>::clear(this);
                QList<QByteArray>::reserve(this,qVar29);
                local_98 = (undefined1  [8])0x0;
                pQStack_90 = (QTzTransition *)0x0;
                local_88 = (undefined1 *)0x0;
                QList<int>::reserve((QList<int> *)local_98,qVar29);
                if ((QMapData<std::map<int,_QByteArray,_std::less<int>,_std::allocator<std::pair<const_int,_QByteArray>_>_>_>
                     *)local_140._0_8_ ==
                    (QMapData<std::map<int,_QByteArray,_std::less<int>,_std::allocator<std::pair<const_int,_QByteArray>_>_>_>
                     *)0x0) {
                  p_Var16 = (_Rb_tree_node_base *)0x0;
                }
                else {
                  p_Var16 = *(_Rb_tree_node_base **)(local_140._0_8_ + 0x20);
                }
                p_Var27 = (_Rb_tree_node_base *)(local_140._0_8_ + 0x10);
                if ((QMapData<std::map<int,_QByteArray,_std::less<int>,_std::allocator<std::pair<const_int,_QByteArray>_>_>_>
                     *)local_140._0_8_ ==
                    (QMapData<std::map<int,_QByteArray,_std::less<int>,_std::allocator<std::pair<const_int,_QByteArray>_>_>_>
                     *)0x0) {
                  p_Var27 = (_Rb_tree_node_base *)0x0;
                }
                if (p_Var16 != p_Var27) {
                  do {
                    QList<QByteArray>::append(this,(parameter_type)&p_Var16[1]._M_parent);
                    QList<int>::append((QList<int> *)local_98,p_Var16[1]._M_color);
                    p_Var16 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var16);
                  } while (p_Var16 != p_Var27);
                }
                if (local_128 == (undefined1 *)0x0) {
LAB_003fb515:
                  iVar14 = (__return_storage_ptr__->m_preZoneRule).stdOffset;
                }
                else {
                  puVar30 = (undefined1 *)0x0;
                  do {
                    if (local_88 == (undefined1 *)0x0) {
LAB_003fb4da:
                      qVar19 = 0xff;
                    }
                    else {
                      qVar19 = 0xff;
                      lVar23 = 0;
                      do {
                        if ((long)local_88 << 2 == lVar23) goto LAB_003fb4da;
                        qVar19 = qVar19 + '\x01';
                        puVar1 = (uint *)((long)&pQStack_90->tz_time + lVar23);
                        lVar23 = lVar23 + 4;
                      } while (*puVar1 !=
                               (uint)*(byte *)((long)&pQStack_130->tz_time + (long)puVar30 * 8 + 5))
                      ;
                    }
                    pQVar17 = QList<QTzType>::data((QList<QTzType> *)(local_140 + 8));
                    pQVar17[(long)puVar30].tz_abbrind = qVar19;
                    puVar30 = puVar30 + 1;
                  } while (puVar30 < local_128);
                  if (local_128 == (undefined1 *)0x0) goto LAB_003fb515;
                  iVar14 = (int)pQStack_130->tz_time;
                  qVar19 = *(quint8 *)((long)&pQStack_130->tz_time + 5);
                  (__return_storage_ptr__->m_preZoneRule).stdOffset = iVar14;
                  (__return_storage_ptr__->m_preZoneRule).dstOffset = 0;
                  (__return_storage_ptr__->m_preZoneRule).abbreviationIndex = qVar19;
                }
                if ((undefined1 *)local_118.d.size != (undefined1 *)0x0) {
                  lVar23 = 0;
                  do {
                    if (*(char *)((long)&pQStack_130->tz_time +
                                 (ulong)(&(local_118.d.ptr)->tz_typeind)[lVar23] * 8 + 4) == '\0') {
                      iVar14 = (int)(&pQStack_130->tz_time)
                                    [(&(local_118.d.ptr)->tz_typeind)[lVar23]];
                      break;
                    }
                    lVar23 = lVar23 + 0x10;
                  } while (local_118.d.size << 4 != lVar23);
                }
                uVar28 = (uint)local_118.d.size;
                QList<QTzTransitionTime>::reserve
                          (&__return_storage_ptr__->m_tranTimes,(long)(int)uVar28);
                if (0 < (int)uVar28) {
                  iVar20 = 0xe10;
                  lVar23 = 0x18;
                  uVar31 = 0;
                  do {
                    pQVar7 = local_118.d.ptr;
                    local_158.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
                    local_158.d.ptr = (QTzTransition *)&DAT_aaaaaaaaaaaaaaaa;
                    uVar18 = (ulong)local_118.d.ptr[uVar31].tz_typeind;
                    iVar3 = (int)(&pQStack_130->tz_time)[uVar18];
                    iVar10 = iVar3;
                    if (((*(byte *)((long)&pQStack_130->tz_time + uVar18 * 8 + 4) & 1) != 0) &&
                       (iVar10 = iVar14, iVar3 != iVar20 + iVar14)) {
                      iVar20 = iVar3 - iVar20;
                      iVar10 = iVar3 + -0xe10;
                      pbVar25 = (byte *)((long)&(local_118.d.ptr)->tz_time + lVar23);
                      uVar26 = uVar31;
                      do {
                        uVar26 = uVar26 + 1;
                        if ((uVar28 & 0x7fffffff) <= uVar26) break;
                        bVar2 = *(byte *)((long)&pQStack_130->tz_time + (ulong)*pbVar25 * 8 + 4);
                        iVar11 = iVar14;
                        if (((((bVar2 & 1) == 0) &&
                             (iVar4 = (int)(&pQStack_130->tz_time)[*pbVar25], iVar4 != iVar14)) &&
                            (uVar24 = iVar4 - iVar20, iVar11 = iVar20, uVar24 != 0)) &&
                           ((iVar11 = iVar10, iVar10 != iVar14 && (iVar10 != iVar4)))) {
                          if (iVar4 < iVar3) {
                            if (iVar14 < iVar3) {
LAB_003fb67c:
                              uVar21 = -uVar24;
                              if (0 < (int)uVar24) {
                                uVar21 = uVar24;
                              }
                              uVar22 = iVar14 - iVar20;
                              uVar24 = -uVar22;
                              if (0 < (int)uVar22) {
                                uVar24 = uVar22;
                              }
                              iVar11 = iVar14;
                              if (uVar24 <= uVar21) goto LAB_003fb66a;
                            }
                            iVar11 = iVar4;
                          }
                          else {
                            iVar11 = iVar14;
                            if (iVar3 <= iVar14) goto LAB_003fb67c;
                          }
                        }
LAB_003fb66a:
                        iVar14 = iVar11;
                        pbVar25 = pbVar25 + 0x10;
                      } while ((bVar2 & 1) != 0);
                      iVar20 = iVar3 - iVar14;
                      iVar10 = iVar14;
                    }
                    iVar14 = iVar10;
                    local_c8._4_4_ = iVar3 - iVar14;
                    local_c8._0_4_ = iVar14;
                    local_c8._9_3_ = 0xaaaaaa;
                    local_c8[8] = *(quint8 *)((long)&pQStack_130->tz_time + uVar18 * 8 + 5);
                    qVar29 = QtPrivate::indexOf<QTzTransitionRule,QTzTransitionRule>
                                       (&__return_storage_ptr__->m_tranRules,
                                        (QTzTransitionRule *)local_c8,0);
                    if ((int)qVar29 == -1) {
                      if (local_c8._4_4_ != 0) {
                        __return_storage_ptr__->m_hasDst = true;
                      }
                      local_158.d.ptr =
                           (QTzTransition *)
                           CONCAT71(local_158.d.ptr._1_7_,
                                    (char)(__return_storage_ptr__->m_tranRules).d.size);
                      QList<QTzTransitionRule>::append
                                (&__return_storage_ptr__->m_tranRules,(parameter_type)local_c8);
                    }
                    else {
                      local_158.d.ptr =
                           (QTzTransition *)CONCAT71(local_158.d.ptr._1_7_,(char)qVar29);
                    }
                    local_158.d.d = (Data *)(pQVar7[uVar31].tz_time * 1000);
                    QList<QTzTransitionTime>::append
                              (&__return_storage_ptr__->m_tranTimes,(parameter_type)&local_158);
                    uVar31 = uVar31 + 1;
                    lVar23 = lVar23 + 0x10;
                  } while (uVar31 != (uVar28 & 0x7fffffff));
                }
                if (local_98 != (undefined1  [8])0x0) {
                  LOCK();
                  (((QBasicAtomicInt *)local_98)->_q_value).super___atomic_base<int>._M_i =
                       (((QBasicAtomicInt *)local_98)->_q_value).super___atomic_base<int>._M_i + -1;
                  UNLOCK();
                  if ((((QBasicAtomicInt *)local_98)->_q_value).super___atomic_base<int>._M_i == 0)
                  {
                    QArrayData::deallocate((QArrayData *)local_98,4,0x10);
                  }
                }
              }
            }
          }
        }
LAB_003fb02a:
        QtPrivate::
        QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QByteArray,_std::less<int>,_std::allocator<std::pair<const_int,_QByteArray>_>_>_>_>
        ::~QExplicitlySharedDataPointerV2
                  ((QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QByteArray,_std::less<int>,_std::allocator<std::pair<const_int,_QByteArray>_>_>_>_>
                    *)local_140);
      }
      if ((QMapData<std::map<int,_QByteArray,_std::less<int>,_std::allocator<std::pair<const_int,_QByteArray>_>_>_>
           *)local_140._8_8_ !=
          (QMapData<std::map<int,_QByteArray,_std::less<int>,_std::allocator<std::pair<const_int,_QByteArray>_>_>_>
           *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_140._8_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_140._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_140._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_140._8_8_,8,0x10);
        }
      }
    }
    if ((QMapData<std::map<int,_QByteArray,_std::less<int>,_std::allocator<std::pair<const_int,_QByteArray>_>_>_>
         *)local_118.d.d !=
        (QMapData<std::map<int,_QByteArray,_std::less<int>,_std::allocator<std::pair<const_int,_QByteArray>_>_>_>
         *)0x0) {
      LOCK();
      ((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_118.d.d)->super_QArrayData,0x10,0x10);
      }
    }
  }
  if ((QMapData<std::map<int,_QByteArray,_std::less<int>,_std::allocator<std::pair<const_int,_QByteArray>_>_>_>
       *)local_f8.d.d !=
      (QMapData<std::map<int,_QByteArray,_std::less<int>,_std::allocator<std::pair<const_int,_QByteArray>_>_>_>
       *)0x0) {
    LOCK();
    ((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_f8.d.d)->super_QArrayData,1,0x10);
    }
  }
  QDataStream::~QDataStream((QDataStream *)local_b8);
LAB_003fae38:
  QFile::~QFile(&local_d8);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

QTzTimeZoneCacheEntry QTzTimeZoneCache::findEntry(const QByteArray &ianaId)
{
    QTzTimeZoneCacheEntry ret;
    QFile tzif;
    if (ianaId.isEmpty()) {
        // Open system tz
        tzif.setFileName(QStringLiteral("/etc/localtime"));
        if (!tzif.open(QIODevice::ReadOnly))
            return ret;
    } else if (!openZoneInfo(QString::fromLocal8Bit(ianaId), &tzif)) {
        // ianaId may be a POSIX rule, taken from $TZ or /etc/TZ
        auto check = validatePosixRule(ianaId);
        if (check.isValid) {
            ret.m_hasDst = check.hasDst;
            ret.m_posixRule = ianaId;
        }
        return ret;
    }

    QDataStream ds(&tzif);

    // Parse the old version block of data
    bool ok = false;
    QByteArray posixRule;
    QTzHeader hdr = parseTzHeader(ds, &ok);
    if (!ok || ds.status() != QDataStream::Ok)
        return ret;
    QList<QTzTransition> tranList = parseTzTransitions(ds, hdr.tzh_timecnt, false);
    if (ds.status() != QDataStream::Ok)
        return ret;
    QList<QTzType> typeList = parseTzTypes(ds, hdr.tzh_typecnt);
    if (ds.status() != QDataStream::Ok)
        return ret;
    QMap<int, QByteArray> abbrevMap = parseTzAbbreviations(ds, hdr.tzh_charcnt, typeList);
    if (ds.status() != QDataStream::Ok)
        return ret;
    parseTzLeapSeconds(ds, hdr.tzh_leapcnt, false);
    if (ds.status() != QDataStream::Ok)
        return ret;
    typeList = parseTzIndicators(ds, typeList, hdr.tzh_ttisstdcnt, hdr.tzh_ttisgmtcnt);
    if (ds.status() != QDataStream::Ok)
        return ret;

    // If version 2 then parse the second block of data
    if (hdr.tzh_version == '2' || hdr.tzh_version == '3') {
        ok = false;
        QTzHeader hdr2 = parseTzHeader(ds, &ok);
        if (!ok || ds.status() != QDataStream::Ok)
            return ret;
        tranList = parseTzTransitions(ds, hdr2.tzh_timecnt, true);
        if (ds.status() != QDataStream::Ok)
            return ret;
        typeList = parseTzTypes(ds, hdr2.tzh_typecnt);
        if (ds.status() != QDataStream::Ok)
            return ret;
        abbrevMap = parseTzAbbreviations(ds, hdr2.tzh_charcnt, typeList);
        if (ds.status() != QDataStream::Ok)
            return ret;
        parseTzLeapSeconds(ds, hdr2.tzh_leapcnt, true);
        if (ds.status() != QDataStream::Ok)
            return ret;
        typeList = parseTzIndicators(ds, typeList, hdr2.tzh_ttisstdcnt, hdr2.tzh_ttisgmtcnt);
        if (ds.status() != QDataStream::Ok)
            return ret;
        posixRule = parseTzPosixRule(ds);
        if (ds.status() != QDataStream::Ok)
            return ret;
    }
    // Translate the TZ file's raw data into our internal form:

    if (!posixRule.isEmpty()) {
        auto check = validatePosixRule(posixRule);
        if (!check.isValid) // We got a POSIX rule, but it was malformed:
            return ret;
        ret.m_posixRule = posixRule;
        ret.m_hasDst = check.hasDst;
    }

    // Translate the array-index-based tz_abbrind into list index
    const int size = abbrevMap.size();
    ret.m_abbreviations.clear();
    ret.m_abbreviations.reserve(size);
    QList<int> abbrindList;
    abbrindList.reserve(size);
    for (auto it = abbrevMap.cbegin(), end = abbrevMap.cend(); it != end; ++it) {
        ret.m_abbreviations.append(it.value());
        abbrindList.append(it.key());
    }
    // Map tz_abbrind from map's keys (as initially read) to abbrindList's
    // indices (used hereafter):
    for (int i = 0; i < typeList.size(); ++i)
        typeList[i].tz_abbrind = abbrindList.indexOf(typeList.at(i).tz_abbrind);

    // TODO: is typeList[0] always the "before zones" data ? It seems to be ...
    if (typeList.size())
        ret.m_preZoneRule = { typeList.at(0).tz_gmtoff, 0, typeList.at(0).tz_abbrind };

    // Offsets are stored as total offset, want to know separate UTC and DST offsets
    // so find the first non-dst transition to use as base UTC Offset
    int utcOffset = ret.m_preZoneRule.stdOffset;
    for (const QTzTransition &tran : std::as_const(tranList)) {
        if (!typeList.at(tran.tz_typeind).tz_isdst) {
            utcOffset = typeList.at(tran.tz_typeind).tz_gmtoff;
            break;
        }
    }

    // Now for each transition time calculate and store our rule:
    const int tranCount = tranList.size();
    ret.m_tranTimes.reserve(tranCount);
    // The DST offset when in effect: usually stable, usually an hour:
    int lastDstOff = 3600;
    for (int i = 0; i < tranCount; i++) {
        const QTzTransition &tz_tran = tranList.at(i);
        QTzTransitionTime tran;
        QTzTransitionRule rule;
        const QTzType tz_type = typeList.at(tz_tran.tz_typeind);

        // Calculate the associated Rule
        if (!tz_type.tz_isdst) {
            utcOffset = tz_type.tz_gmtoff;
        } else if (Q_UNLIKELY(tz_type.tz_gmtoff != utcOffset + lastDstOff)) {
            /*
              This might be a genuine change in DST offset, but could also be
              DST starting at the same time as the standard offset changed.  See
              if DST's end gives a more plausible utcOffset (i.e. one closer to
              the last we saw, or a simple whole hour):
            */
            // Standard offset inferred from net offset and expected DST offset:
            const int inferStd = tz_type.tz_gmtoff - lastDstOff; // != utcOffset
            for (int j = i + 1; j < tranCount; j++) {
                const QTzType new_type = typeList.at(tranList.at(j).tz_typeind);
                if (!new_type.tz_isdst) {
                    const int newUtc = new_type.tz_gmtoff;
                    if (newUtc == utcOffset) {
                        // DST-end can't help us, avoid lots of messy checks.
                    // else: See if the end matches the familiar DST offset:
                    } else if (newUtc == inferStd) {
                        utcOffset = newUtc;
                    // else: let either end shift us to one hour as DST offset:
                    } else if (tz_type.tz_gmtoff - 3600 == utcOffset) {
                        // Start does it
                    } else if (tz_type.tz_gmtoff - 3600 == newUtc) {
                        utcOffset = newUtc; // End does it
                    // else: prefer whichever end gives DST offset closer to
                    // last, but consider any offset > 0 "closer" than any <= 0:
                    } else if (newUtc < tz_type.tz_gmtoff
                               ? (utcOffset >= tz_type.tz_gmtoff
                                  || qAbs(newUtc - inferStd) < qAbs(utcOffset - inferStd))
                               : (utcOffset >= tz_type.tz_gmtoff
                                  && qAbs(newUtc - inferStd) < qAbs(utcOffset - inferStd))) {
                        utcOffset = newUtc;
                    }
                    break;
                }
            }
            lastDstOff = tz_type.tz_gmtoff - utcOffset;
        }
        rule.stdOffset = utcOffset;
        rule.dstOffset = tz_type.tz_gmtoff - utcOffset;
        rule.abbreviationIndex = tz_type.tz_abbrind;

        // If the rule already exist then use that, otherwise add it
        int ruleIndex = ret.m_tranRules.indexOf(rule);
        if (ruleIndex == -1) {
            if (rule.dstOffset != 0)
                ret.m_hasDst = true;
            tran.ruleIndex = ret.m_tranRules.size();
            ret.m_tranRules.append(rule);
        } else {
            tran.ruleIndex = ruleIndex;
        }

        tran.atMSecsSinceEpoch = tz_tran.tz_time * 1000;
        ret.m_tranTimes.append(tran);
    }

    return ret;
}